

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

DWORD MAPConvertProtectToAccess(DWORD flProtect)

{
  DWORD local_c;
  DWORD flProtect_local;
  
  if (flProtect == 2) {
    local_c = 4;
  }
  else if (flProtect == 4) {
    local_c = 6;
  }
  else if (flProtect == 8) {
    local_c = 1;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","MAPConvertProtectToAccess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x686);
    fprintf(_stderr,"Unknown flag for flProtect. This line should not have been executed.\n ");
    local_c = 0xffffffff;
  }
  return local_c;
}

Assistant:

static DWORD MAPConvertProtectToAccess( DWORD flProtect )
{
    if ( PAGE_READONLY == flProtect )
    {
        return FILE_MAP_READ;
    }
    if ( PAGE_READWRITE == flProtect )
    {
        return FILE_MAP_ALL_ACCESS;
    }
    if ( PAGE_WRITECOPY == flProtect )
    {
        return FILE_MAP_COPY;
    }

    ASSERT( "Unknown flag for flProtect. This line "
            "should not have been executed.\n " );
    return (DWORD) -1;
}